

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O0

void __thiscall UnitTest_table5::Run(UnitTest_table5 *this)

{
  bool bVar1;
  UnitTestBase *this_00;
  Value VVar2;
  int i;
  Value value;
  Value key;
  Table t;
  Table *in_stack_fffffffffffffdd0;
  Value *in_stack_fffffffffffffde8;
  Table *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  size_t in_stack_fffffffffffffe00;
  Table *in_stack_fffffffffffffe08;
  UnitTestBase *in_stack_fffffffffffffe10;
  allocator local_1b9;
  string local_1b8 [39];
  undefined1 local_191 [33];
  anon_union_8_9_8deb4486_for_Value_0 local_170;
  ValueT local_168;
  anon_union_8_9_8deb4486_for_Value_0 local_160;
  ValueT local_158;
  undefined1 local_149 [40];
  undefined1 local_121 [33];
  anon_union_8_9_8deb4486_for_Value_0 local_100;
  ValueT local_f8;
  anon_union_8_9_8deb4486_for_Value_0 local_f0;
  ValueT local_e8;
  undefined1 local_d9 [40];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [36];
  int local_64;
  anon_union_8_9_8deb4486_for_Value_0 local_60;
  ValueT local_58;
  anon_union_8_9_8deb4486_for_Value_0 local_40;
  undefined4 local_38;
  
  luna::Table::Table(in_stack_fffffffffffffdd0);
  luna::Value::Value((Value *)&local_40);
  luna::Value::Value((Value *)&local_60);
  local_58 = 2;
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    local_60.num_ = (double)(local_64 + 1);
    luna::Table::InsertArrayValue
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (Value *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  bVar1 = luna::Table::EraseArrayValue
                    ((Table *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (size_t)in_stack_fffffffffffffdf0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"\'t.EraseArrayValue(1)\'",&local_89);
    UnitTestBase::Error(in_stack_fffffffffffffe10,(string *)in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  bVar1 = luna::Table::EraseArrayValue
                    ((Table *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (size_t)in_stack_fffffffffffffdf0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"\'t.EraseArrayValue(1)\'",&local_b1);
    UnitTestBase::Error(in_stack_fffffffffffffe10,(string *)in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  this_00 = (UnitTestBase *)luna::Table::ArraySize(in_stack_fffffffffffffdd0);
  if (this_00 != (UnitTestBase *)0x2) {
    in_stack_fffffffffffffe08 = (Table *)local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_d9 + 1),"\'t.ArraySize() == 2\'",
               (allocator *)in_stack_fffffffffffffe08);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffe08);
    std::__cxx11::string::~string((string *)(local_d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d9);
  }
  local_38 = 2;
  local_40.num_ = 1.0;
  VVar2 = luna::Table::GetValue(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_100 = VVar2.field_0;
  local_f8 = VVar2.type_;
  local_f0 = local_100;
  local_e8 = local_f8;
  local_60 = local_100;
  local_58 = local_f8;
  if (local_f8 != ValueT_Number) {
    in_stack_fffffffffffffdf0 = (Table *)local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_121 + 1),"\'value.type_ == luna::ValueT_Number\'",
               (allocator *)in_stack_fffffffffffffdf0);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffe08);
    std::__cxx11::string::~string((string *)(local_121 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_121);
  }
  if ((local_60.num_ != 3.0) || (NAN(local_60.num_))) {
    in_stack_fffffffffffffde8 = (Value *)local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_149 + 1),"\'value.num_ == 3\'",
               (allocator *)in_stack_fffffffffffffde8);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffe08);
    std::__cxx11::string::~string((string *)(local_149 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_149);
  }
  local_40.num_ = 2.0;
  VVar2 = luna::Table::GetValue(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_170 = VVar2.field_0;
  local_168 = VVar2.type_;
  local_160 = local_170;
  local_158 = local_168;
  local_60 = local_170;
  local_58 = local_168;
  if (local_168 != ValueT_Number) {
    in_stack_fffffffffffffdd0 = (Table *)local_191;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_191 + 1),"\'value.type_ == luna::ValueT_Number\'",
               (allocator *)in_stack_fffffffffffffdd0);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffe08);
    std::__cxx11::string::~string((string *)(local_191 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_191);
  }
  if ((local_60.num_ != 4.0) || (NAN(local_60.num_))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"\'value.num_ == 4\'",&local_1b9);
    UnitTestBase::Error(this_00,(string *)in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  luna::Table::~Table(in_stack_fffffffffffffdd0);
  return;
}

Assistant:

TEST_CASE(table5)
{
    luna::Table t;
    luna::Value key;
    luna::Value value;

    value.type_ = luna::ValueT_Number;

    for (int i = 0; i < 4; ++i)
    {
        value.num_ = i + 1;
        t.InsertArrayValue(i + 1, value);
    }

    EXPECT_TRUE(t.EraseArrayValue(1));
    EXPECT_TRUE(t.EraseArrayValue(1));

    EXPECT_TRUE(t.ArraySize() == 2);

    key.type_ = luna::ValueT_Number;

    key.num_ = 1;
    value = t.GetValue(key);
    EXPECT_TRUE(value.type_ == luna::ValueT_Number);
    EXPECT_TRUE(value.num_ == 3);

    key.num_ = 2;
    value = t.GetValue(key);
    EXPECT_TRUE(value.type_ == luna::ValueT_Number);
    EXPECT_TRUE(value.num_ == 4);
}